

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_registrars.hpp
# Opt level: O3

void __thiscall
Catch::ListenerRegistrar<Catch2ApprovalListener>::ListenerRegistrar
          (ListenerRegistrar<Catch2ApprovalListener> *this,StringRef listenerName)

{
  unique_ptr<Catch::EventListenerFactory> local_18;
  
  local_18.m_ptr = (EventListenerFactory *)operator_new(0x18);
  (local_18.m_ptr)->_vptr_EventListenerFactory = (_func_int **)&PTR__EventListenerFactory_001aace0;
  local_18.m_ptr[1]._vptr_EventListenerFactory = (_func_int **)listenerName.m_start;
  local_18.m_ptr[2]._vptr_EventListenerFactory = (_func_int **)listenerName.m_size;
  Detail::registerListenerImpl(&local_18);
  if (local_18.m_ptr != (EventListenerFactory *)0x0) {
    (*(local_18.m_ptr)->_vptr_EventListenerFactory[1])();
  }
  return;
}

Assistant:

ListenerRegistrar(StringRef listenerName) {
            registerListenerImpl( Detail::make_unique<TypedListenerFactory>(listenerName) );
        }